

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O0

int __thiscall cab_manager::remove(cab_manager *this,char *__filename)

{
  __shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  mapped_type *pmVar1;
  size_type sVar2;
  const_iterator local_40;
  id_type *local_38;
  weak_ptr<cab> *local_30;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  local_28;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  local_20;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  it;
  node_type pos;
  id_type id_local;
  cab_manager *this_local;
  
  it._M_current._4_4_ = SUB84(__filename,0);
  this_00 = (__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            unordered_map<unsigned_int,_std::shared_ptr<cab>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>_>
            ::operator[](&this->_cabs,(key_type *)((long)&it._M_current + 4));
  this_01 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      (this_00);
  it._M_current._3_1_ = cab::position(this_01);
  pmVar1 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](&this->_cabs_at_node,(key_type *)((long)&it._M_current + 3));
  local_28._M_current =
       (weak_ptr<cab> *)
       std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::begin(pmVar1);
  pmVar1 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](&this->_cabs_at_node,(key_type *)((long)&it._M_current + 3));
  local_30 = (weak_ptr<cab> *)
             std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::end(pmVar1);
  local_38 = (id_type *)((long)&it._M_current + 4);
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<std::weak_ptr<cab>*,std::vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>>>,cab_manager::remove(unsigned_int)::__0>
                       (local_28,(__normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
                                  )local_30,(anon_class_8_1_3fcf65d9_for__M_pred)local_38);
  pmVar1 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](&this->_cabs_at_node,(key_type *)((long)&it._M_current + 3));
  __gnu_cxx::
  __normal_iterator<std::weak_ptr<cab>const*,std::vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>>>
  ::__normal_iterator<std::weak_ptr<cab>*>
            ((__normal_iterator<std::weak_ptr<cab>const*,std::vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>>>
              *)&local_40,&local_20);
  std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::erase(pmVar1,local_40);
  sVar2 = std::
          unordered_map<unsigned_int,_std::shared_ptr<cab>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>_>
          ::erase(&this->_cabs,(key_type *)((long)&it._M_current + 4));
  return (int)sVar2;
}

Assistant:

void cab_manager::remove(id_type id)
{
    node_type pos = _cabs[id]->position();
    auto it = std::find_if(_cabs_at_node[pos].begin(), _cabs_at_node[pos].end(), 
        [&id](const std::weak_ptr<cab>& cab){
            auto shared = cab.lock();
            return shared->id() == id;
    });
    _cabs_at_node[pos].erase(it);
    _cabs.erase(id);
}